

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
upb::generator::SortedUniqueEnumNumbers
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,EnumDefPtr e)

{
  iterator __position;
  pointer puVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  upb_EnumValueDef *v;
  ulong uVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var8
  ;
  pointer puVar9;
  int i;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  iVar4 = upb_EnumDef_ValueCount(e.ptr_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (__return_storage_ptr__,(long)iVar4);
  iVar4 = 0;
  while( true ) {
    iVar5 = upb_EnumDef_ValueCount(e.ptr_);
    if (iVar5 <= iVar4) break;
    v = upb_EnumDef_Value(e.ptr_,iVar4);
    uVar6 = upb_EnumValueDef_Number(v);
    uStack_28 = CONCAT44(uVar6,(undefined4)uStack_28);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (__return_storage_ptr__,__position,(uint *)((long)&uStack_28 + 4));
    }
    else {
      *__position._M_current = uVar6;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar4 = iVar4 + 1;
  }
  puVar1 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar9) {
    uVar7 = (long)puVar9 - (long)puVar1 >> 2;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar9,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar9);
  }
  _Var8 = std::
          __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((__return_storage_ptr__->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  puVar2 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var8._M_current != puVar2) &&
     (puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     puVar9 = (pointer)((long)_Var8._M_current + ((long)puVar1 - (long)puVar2)), puVar1 != puVar9))
  {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> SortedUniqueEnumNumbers(upb::EnumDefPtr e) {
  std::vector<uint32_t> values;
  values.reserve(e.value_count());
  for (int i = 0; i < e.value_count(); i++) {
    values.push_back(static_cast<uint32_t>(e.value(i).number()));
  }
  std::sort(values.begin(), values.end());
  auto last = std::unique(values.begin(), values.end());
  values.erase(last, values.end());
  return values;
}